

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O1

void __thiscall
LLVMBC::StreamState::
append<unsigned_long,char_const(&)[18],LLVMBC::Value*,char_const(&)[3],LLVMBC::Value*,char_const(&)[3],LLVMBC::Value*>
          (StreamState *this,unsigned_long *t,char (*ts) [18],Value **ts_1,char (*ts_2) [3],
          Value **ts_3,char (*ts_4) [3],Value **ts_5)

{
  size_t sVar1;
  
  std::ostream::_M_insert<unsigned_long>((ulong)this);
  sVar1 = strlen(*ts);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,*ts,sVar1);
  append<LLVMBC::Value*,char_const(&)[3],LLVMBC::Value*,char_const(&)[3],LLVMBC::Value*>
            (this,ts_1,ts_2,ts_3,ts_4,ts_5);
  return;
}

Assistant:

void append(T &&t, Ts &&... ts)
	{
		append(std::forward<T>(t));
		append(std::forward<Ts>(ts)...);
	}